

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmodel.hpp
# Opt level: O0

bool __thiscall
QtMWidgets::ListModel<QColor>::setData(ListModel<QColor> *this,int row,QColor *value)

{
  ListModelPrivate<QColor> *pLVar1;
  qsizetype qVar2;
  reference pQVar3;
  QColor *value_local;
  int row_local;
  ListModel<QColor> *this_local;
  
  pLVar1 = QScopedPointer<QtMWidgets::ListModelPrivate<QColor>,_QScopedPointerDeleter<QtMWidgets::ListModelPrivate<QColor>_>_>
           ::operator->(&this->d);
  qVar2 = QList<QColor>::count(&pLVar1->data);
  if (row < qVar2) {
    pLVar1 = QScopedPointer<QtMWidgets::ListModelPrivate<QColor>,_QScopedPointerDeleter<QtMWidgets::ListModelPrivate<QColor>_>_>
             ::operator->(&this->d);
    pQVar3 = QList<QColor>::operator[](&pLVar1->data,(long)row);
    *(undefined8 *)pQVar3 = *(undefined8 *)value;
    *(undefined4 *)((long)&pQVar3->ct + 4) = *(undefined4 *)((long)&value->ct + 4);
    (pQVar3->ct).argb.pad = (value->ct).argb.pad;
    AbstractListModel::dataChanged(&this->super_AbstractListModel,row,row);
  }
  return row < qVar2;
}

Assistant:

virtual bool setData( int row, const T & value )
	{
		if( row >= d->data.count() )
			return false;

		d->data[ row ] = value;

		emit dataChanged( row, row );

		return true;
	}